

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O3

QSize __thiscall
QProxyStyle::sizeFromContents
          (QProxyStyle *this,ContentsType type,QStyleOption *option,QSize *size,QWidget *widget)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  QSize QVar2;
  
  this_00 = *(QProxyStylePrivate **)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  QVar2 = (QSize)(**(code **)(*(long *)pQVar1 + 0xe8))(pQVar1,type,option,size,widget);
  return QVar2;
}

Assistant:

QSize QProxyStyle::sizeFromContents(ContentsType type, const QStyleOption *option, const QSize &size, const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->sizeFromContents(type, option, size, widget);
}